

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>::setCapacity
          (Vector<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *this,
          size_t newSize)

{
  Located<capnp::Text::Reader> *pLVar1;
  Located<capnp::Text::Reader> *pLVar2;
  RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pRVar3;
  Located<capnp::Text::Reader> *pLVar4;
  ArrayDisposer *pAVar5;
  Located<capnp::Text::Reader> *__dest;
  ulong uVar6;
  size_t __n;
  ArrayBuilder<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> newBuilder;
  Located<capnp::Text::Reader> *pLVar7;
  Located<capnp::Text::Reader> *pLVar8;
  undefined8 *puVar9;
  
  pLVar1 = (this->builder).ptr;
  uVar6 = ((long)(this->builder).pos - (long)pLVar1 >> 3) * -0x5555555555555555;
  if (newSize <= uVar6 && uVar6 - newSize != 0) {
    (this->builder).pos = pLVar1 + newSize;
  }
  __dest = (Located<capnp::Text::Reader> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pLVar1 = __dest + newSize;
  puVar9 = &kj::_::HeapArrayDisposer::instance;
  pLVar2 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pLVar2;
  pLVar7 = __dest;
  pLVar8 = pLVar1;
  if (__n != 0) {
    memcpy(__dest,pLVar2,__n);
  }
  pLVar2 = (this->builder).ptr;
  if (pLVar2 != (Located<capnp::Text::Reader> *)0x0) {
    pRVar3 = (this->builder).pos;
    pLVar4 = (this->builder).endPtr;
    (this->builder).ptr = (Located<capnp::Text::Reader> *)0x0;
    (this->builder).pos =
         (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
    (this->builder).endPtr = (Located<capnp::Text::Reader> *)0x0;
    pAVar5 = (this->builder).disposer;
    (**pAVar5->_vptr_ArrayDisposer)
              (pAVar5,pLVar2,0x18,((long)pRVar3 - (long)pLVar2 >> 3) * -0x5555555555555555,
               ((long)pLVar4 - (long)pLVar2 >> 3) * -0x5555555555555555,0,pLVar7,
               (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *
               )((long)__dest + __n),pLVar8,puVar9);
  }
  (this->builder).ptr = __dest;
  (this->builder).pos =
       (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)
       ((long)__dest + __n);
  (this->builder).endPtr = pLVar1;
  (this->builder).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }